

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  uint32_t *puVar4;
  ptls_iovec_t *ppVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *end_00;
  uint8_t *puVar8;
  ptls_iovec_t pVar9;
  uint8_t *local_d8;
  size_t local_d0;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  st_ptls_extension_bitmap_t bitmap;
  size_t local_88;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t local_60;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t exttype;
  uint32_t *max_early_data_size_local;
  ptls_iovec_t *ticket_local;
  ptls_iovec_t *nonce_local;
  uint32_t *age_add_local;
  uint32_t *lifetime_local;
  ptls_t *tls_local;
  
  _ret = max_early_data_size;
  max_early_data_size_local = (uint32_t *)ticket;
  ticket_local = nonce;
  nonce_local = (ptls_iovec_t *)age_add;
  age_add_local = lifetime;
  lifetime_local = (uint32_t *)tls;
  _capacity._0_4_ = ptls_decode32(lifetime,&src,end);
  if (((uint)_capacity == 0) &&
     (_capacity._0_4_ = ptls_decode32((uint32_t *)nonce_local,&src,end), ppVar5 = ticket_local,
     (uint)_capacity == 0)) {
    _block_size = 1;
    if (end == src) {
      _capacity._0_4_ = 0x32;
    }
    else {
      end_1 = (uint8_t *)0x0;
      do {
        puVar8 = src + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*src);
        _block_size = _block_size - 1;
        src = puVar8;
      } while (_block_size != 0);
      if (end + -(long)puVar8 < end_1) {
        _capacity._0_4_ = 0x32;
      }
      else {
        puVar7 = puVar8 + (long)end_1;
        pVar9 = ptls_iovec_init(puVar8,(long)puVar7 - (long)puVar8);
        puVar4 = max_early_data_size_local;
        _capacity_1 = (size_t)pVar9.base;
        ppVar5->base = (uint8_t *)_capacity_1;
        local_60 = pVar9.len;
        ppVar5->len = local_60;
        _block_size_1 = 2;
        if ((ulong)((long)end - (long)puVar7) < 2) {
          _capacity._0_4_ = 0x32;
        }
        else {
          end_2 = (uint8_t *)0x0;
          src = puVar7;
          do {
            puVar8 = src + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*src);
            _block_size_1 = _block_size_1 - 1;
            src = puVar8;
          } while (_block_size_1 != 0);
          if (end + -(long)puVar8 < end_2) {
            _capacity._0_4_ = 0x32;
          }
          else {
            puVar7 = puVar8 + (long)end_2;
            if (puVar8 == puVar7) {
              _capacity._0_4_ = 0x32;
            }
            else {
              _bitmap = ptls_iovec_init(puVar8,(long)puVar7 - (long)puVar8);
              *(uint8_t (*) [8])puVar4 = bitmap.bits;
              *(size_t *)(puVar4 + 2) = local_88;
              *_ret = 0;
              src = puVar7;
              init_extension_bitmap((st_ptls_extension_bitmap_t *)&_capacity_2,'\x04');
              _block_size_2 = 2;
              if ((ulong)((long)end - (long)src) < 2) {
                _capacity._0_4_ = 0x32;
              }
              else {
                end_3 = (uint8_t *)0x0;
                do {
                  puVar8 = src + 1;
                  end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*src);
                  _block_size_2 = _block_size_2 - 1;
                  src = puVar8;
                } while (_block_size_2 != 0);
                if (end + -(long)puVar8 < end_3) {
                  _capacity._0_4_ = 0x32;
                }
                else {
                  puVar8 = puVar8 + (long)end_3;
                  do {
                    if (src == puVar8) {
                      if (src != puVar8) {
                        return 0x32;
                      }
                      if (src != end) {
                        return 0x32;
                      }
                      return 0;
                    }
                    _capacity._0_4_ = ptls_decode16((uint16_t *)((long)&_capacity + 6),&src,puVar8);
                    if ((uint)_capacity != 0) {
                      return (uint)_capacity;
                    }
                    iVar6 = extension_bitmap_is_set
                                      ((st_ptls_extension_bitmap_t *)&_capacity_2,_capacity._6_2_);
                    if (iVar6 != 0) {
                      return 0x2f;
                    }
                    extension_bitmap_set((st_ptls_extension_bitmap_t *)&_capacity_2,_capacity._6_2_)
                    ;
                    puVar4 = lifetime_local;
                    uVar3 = _capacity._6_2_;
                    _block_size_3 = 2;
                    if ((ulong)((long)puVar8 - (long)src) < 2) {
                      return 0x32;
                    }
                    end_4 = (uint8_t *)0x0;
                    do {
                      puVar7 = src + 1;
                      end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*src);
                      _block_size_3 = _block_size_3 - 1;
                      src = puVar7;
                    } while (_block_size_3 != 0);
                    if (puVar8 + -(long)puVar7 < end_4) {
                      return 0x32;
                    }
                    end_00 = puVar7 + (long)end_4;
                    if (*(long *)(*(long *)lifetime_local + 0xb8) != 0) {
                      pcVar1 = (code *)**(undefined8 **)(*(long *)lifetime_local + 0xb8);
                      uVar2 = *(undefined8 *)(*(long *)lifetime_local + 0xb8);
                      pVar9 = ptls_iovec_init(puVar7,(long)end_00 - (long)puVar7);
                      local_d8 = pVar9.base;
                      local_d0 = pVar9.len;
                      iVar6 = (*pcVar1)(uVar2,puVar4,4,uVar3,local_d8,local_d0);
                      _capacity._0_4_ = (uint)(iVar6 != 0);
                      if (iVar6 != 0) {
                        return (uint)_capacity;
                      }
                    }
                    puVar7 = end_00;
                    if (_capacity._6_2_ == 0x2a) {
                      iVar6 = ptls_decode32(_ret,&src,end_00);
                      if (iVar6 != 0) {
                        return iVar6;
                      }
                      _capacity._0_4_ = 0;
                      puVar7 = src;
                    }
                    src = puVar7;
                  } while (src == end_00);
                  _capacity._0_4_ = 0x32;
                }
              }
            }
          }
        }
      }
    }
  }
  return (uint)_capacity;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}